

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O3

void chaiscript::bootstrap::opers_comparison<std::__cxx11::string>(Module *m)

{
  operators::equal<std::__cxx11::string>(m);
  operators::greater_than<std::__cxx11::string>(m);
  operators::greater_than_equal<std::__cxx11::string>(m);
  operators::less_than<std::__cxx11::string>(m);
  operators::less_than_equal<std::__cxx11::string>(m);
  operators::not_equal<std::__cxx11::string>(m);
  return;
}

Assistant:

void opers_comparison(Module &m) {
    operators::equal<T>(m);
    operators::greater_than<T>(m);
    operators::greater_than_equal<T>(m);
    operators::less_than<T>(m);
    operators::less_than_equal<T>(m);
    operators::not_equal<T>(m);
  }